

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

DatabaseSize * __thiscall
duckdb::SingleFileStorageManager::GetDatabaseSize
          (DatabaseSize *__return_storage_ptr__,SingleFileStorageManager *this)

{
  unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true> *this_00;
  bool bVar1;
  int iVar2;
  pointer pBVar3;
  undefined4 extraout_var;
  idx_t iVar4;
  undefined4 extraout_var_00;
  idx_t iVar5;
  
  __return_storage_ptr__->bytes = 0;
  __return_storage_ptr__->wal_size = 0;
  __return_storage_ptr__->free_blocks = 0;
  __return_storage_ptr__->used_blocks = 0;
  __return_storage_ptr__->total_blocks = 0;
  __return_storage_ptr__->block_size = 0;
  bVar1 = StorageManager::InMemory(&this->super_StorageManager);
  if (!bVar1) {
    this_00 = &this->block_manager;
    pBVar3 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(this_00);
    iVar2 = (*pBVar3->_vptr_BlockManager[0x10])(pBVar3);
    iVar5 = CONCAT44(extraout_var,iVar2);
    __return_storage_ptr__->total_blocks = iVar5;
    pBVar3 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(this_00);
    iVar4 = optional_idx::GetIndex(&pBVar3->block_alloc_size);
    __return_storage_ptr__->block_size = iVar4;
    pBVar3 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(this_00);
    iVar2 = (*pBVar3->_vptr_BlockManager[0x11])(pBVar3);
    __return_storage_ptr__->free_blocks = CONCAT44(extraout_var_00,iVar2);
    __return_storage_ptr__->used_blocks = iVar5 - CONCAT44(extraout_var_00,iVar2);
    __return_storage_ptr__->bytes = iVar4 * iVar5;
    iVar5 = StorageManager::GetWALSize(&this->super_StorageManager);
    __return_storage_ptr__->wal_size = iVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

DatabaseSize SingleFileStorageManager::GetDatabaseSize() {
	// All members default to zero
	DatabaseSize ds;
	if (!InMemory()) {
		ds.total_blocks = block_manager->TotalBlocks();
		ds.block_size = block_manager->GetBlockAllocSize();
		ds.free_blocks = block_manager->FreeBlocks();
		ds.used_blocks = ds.total_blocks - ds.free_blocks;
		ds.bytes = (ds.total_blocks * ds.block_size);
		ds.wal_size = NumericCast<idx_t>(GetWALSize());
	}
	return ds;
}